

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-model.h
# Opt level: O0

void __thiscall mp::NLSuffix::~NLSuffix(NLSuffix *this)

{
  string *in_RDI;
  vector<double,_std::allocator<double>_> *unaff_retaddr;
  
  std::vector<double,_std::allocator<double>_>::~vector(unaff_retaddr);
  std::__cxx11::string::~string(in_RDI + 0x20);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

NLSuffix(std::string name, int kind, std::vector<double> v={})
    : name_(std::move(name)), table_({}), kind_(kind),
      values_(std::move(v)) { }